

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::JobManager::PrepareStartJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  string *this_00;
  ErrorCode EVar1;
  uint64_t uVar2;
  pointer pcVar3;
  char cVar4;
  int iVar5;
  uint __len;
  _Rb_tree_header *p_Var6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  uint __val;
  _Rb_tree_header *p_Var9;
  undefined7 in_register_00000081;
  pointer __k;
  ErrorCode EVar10;
  pointer pcVar11;
  string __str;
  Expression expr;
  BorderRouter br;
  Config conf;
  undefined1 local_378 [8];
  _Alloc_hider local_370;
  undefined1 local_368 [24];
  _Rb_tree_header *local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  undefined4 local_32c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  Expression *local_320;
  CommissionerPool *local_318;
  JobManager *local_310;
  Config *local_308;
  pointer local_300;
  string local_2f8;
  string local_2d8;
  BorderRouter local_2b8;
  Config local_130;
  
  local_32c = (undefined4)CONCAT71(in_register_00000081,aGroupAlias);
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_328 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_328;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_320 = aExpr;
  utils::ToLower((string *)&local_2b8,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  iVar5 = std::__cxx11::string::compare((char *)&local_2b8);
  if ((BorderAgent *)local_2b8._vptr_BorderRouter != &local_2b8.mAgent) {
    operator_delete(local_2b8._vptr_BorderRouter);
  }
  if (iVar5 != 0) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0xca,
                  "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  if ((long)(local_320->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_320->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0xd0,
                  "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  __k = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start;
  local_300 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (__k != local_300) {
    local_308 = &this->mDefaultConf;
    local_318 = &this->mCommissionerPool;
    local_350 = &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header;
    local_310 = this;
    do {
      pcVar11 = local_368 + 8;
      persistent_storage::BorderRouter::BorderRouter(&local_2b8);
      Config::Config(&local_130,local_308);
      PrepareDtlsConfig((Error *)local_378,this,*__k,&local_130);
      __return_storage_ptr__->mCode = local_378._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_370);
      if (local_370._M_p != pcVar11) {
        operator_delete(local_370._M_p);
      }
      local_378 = (undefined1  [8])((ulong)local_378 & 0xffffffff00000000);
      local_368._0_8_ = 0;
      local_368[8] = '\0';
      local_370._M_p = pcVar11;
      if (__return_storage_ptr__->mCode == kNone) {
        p_Var8 = (this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = local_350;
        if (p_Var8 != (_Base_ptr)0x0) {
          do {
            if (*(ulong *)(p_Var8 + 1) >= *__k) {
              p_Var6 = (_Rb_tree_header *)p_Var8;
            }
            p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < *__k];
          } while (p_Var8 != (_Base_ptr)0x0);
        }
        p_Var9 = local_350;
        if ((p_Var6 != local_350) && (p_Var9 = p_Var6, *__k < p_Var6->_M_node_count)) {
          p_Var9 = local_350;
        }
        if (p_Var9 == local_350) {
          local_348.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_348.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          CommissionerAppCreate
                    ((Error *)local_378,(shared_ptr<ot::commissioner::CommissionerApp> *)&local_348,
                     &local_130);
          __return_storage_ptr__->mCode = local_378._0_4_;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_370);
          EVar1 = __return_storage_ptr__->mCode;
          if (local_370._M_p != local_368 + 8) {
            operator_delete(local_370._M_p);
          }
          EVar10 = kOutOfMemory;
          if (EVar1 == kNone) {
            pmVar7 = std::
                     map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                     ::operator[](local_318,__k);
            (pmVar7->
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr = (element_type *)
                     local_348.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(pmVar7->
                        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount,
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_348.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            p_Var8 = (this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var6 = local_350;
            if (p_Var8 != (_Base_ptr)0x0) {
              do {
                if (*(ulong *)(p_Var8 + 1) >= *__k) {
                  p_Var6 = (_Rb_tree_header *)p_Var8;
                }
                p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < *__k];
              } while (p_Var8 != (_Base_ptr)0x0);
            }
            EVar10 = kNone;
            p_Var9 = local_350;
            if ((p_Var6 != local_350) && (p_Var9 = p_Var6, *__k < p_Var6->_M_node_count)) {
              p_Var9 = local_350;
            }
          }
          if (local_348.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_348.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (EVar1 != kNone) goto LAB_0020255c;
        }
        cVar4 = (**(code **)(**(long **)(p_Var9 + 1) + 0x78))();
        if (cVar4 == '\0') {
          MakeBorderRouterChoice((Error *)local_378,this,*__k,&local_2b8);
          __return_storage_ptr__->mCode = local_378._0_4_;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_370);
          EVar1 = __return_storage_ptr__->mCode;
          if (local_370._M_p != local_368 + 8) {
            operator_delete(local_370._M_p);
          }
          EVar10 = kOutOfMemory;
          if (EVar1 == kNone) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_348,local_320);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_348,&local_2b8.mAgent.mAddr);
            local_378 = (undefined1  [8])local_368;
            __len = 1;
            __val = (uint)local_2b8.mAgent.mPort;
            if (((9 < local_2b8.mAgent.mPort) && (__len = 2, 99 < local_2b8.mAgent.mPort)) &&
               (__len = 3, 999 < local_2b8.mAgent.mPort)) {
              __len = 5 - (__val < 10000);
            }
            std::__cxx11::string::_M_construct((ulong)local_378,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_378,__len,__val);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_348,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378);
            this = local_310;
            if (local_378 != (undefined1  [8])local_368) {
              operator_delete((void *)local_378);
            }
            if ((long)local_348.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_348.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x60) {
              __assert_fail("condition",
                            "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                            ,0xf7,
                            "Error ot::commissioner::JobManager::PrepareStartJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                           );
            }
            CreateJob((Error *)local_378,this,(CommissionerAppPtr *)(p_Var9 + 1),&local_348,*__k);
            __return_storage_ptr__->mCode = local_378._0_4_;
            std::__cxx11::string::operator=((string *)this_00,(string *)&local_370);
            EVar10 = __return_storage_ptr__->mCode;
            if (local_370._M_p != local_368 + 8) {
              operator_delete(local_370._M_p);
            }
            if (EVar10 != kNone) {
              EVar10 = kOutOfMemory;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_348);
          }
        }
        else {
          EVar10 = kUnimplemented;
          if ((char)local_32c == '\0') {
            uVar2 = *__k;
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2f8,"already started","");
            InfoMsg(this,uVar2,&local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        uVar2 = *__k;
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        pcVar3 = (__return_storage_ptr__->mMessage)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,pcVar3,
                   pcVar3 + (__return_storage_ptr__->mMessage)._M_string_length);
        ErrorMsg(this,uVar2,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        local_378 = (undefined1  [8])((ulong)local_378 & 0xffffffff00000000);
        local_368._0_8_ = 0;
        local_368[8] = '\0';
        __return_storage_ptr__->mCode = kNone;
        local_370._M_p = pcVar11;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_370);
        if (local_370._M_p != pcVar11) {
          operator_delete(local_370._M_p);
        }
        EVar10 = kUnimplemented;
      }
LAB_0020255c:
      Config::~Config(&local_130);
      local_2b8._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_002e1c80;
      BorderAgent::~BorderAgent(&local_2b8.mAgent);
      if ((EVar10 != kUnimplemented) && (EVar10 != kNone)) goto LAB_002028ef;
      __k = __k + 1;
    } while (__k != local_300);
    EVar10 = kSecurity;
LAB_002028ef:
    if (((EVar10 - kSecurity & 0xfffffffb) != 0) &&
       (pcVar11 = (this_00->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar11 != local_328)) {
      operator_delete(pcVar11);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareStartJobs(const Interpreter::Expression &aExpr,
                                   const std::vector<uint64_t>   &aNids,
                                   bool                           aGroupAlias)
{
    Error error = ERROR_NONE;

    ASSERT(utils::ToLower(aExpr[0]) == "start");
    /*
     * Coming here is a result of using multi-network syntax.
     * Therefore, no extra arguments to be used, otherwise it
     * is multi-network syntax violation.
     */
    ASSERT(aExpr.size() == 1);

    for (const auto &nid : aNids)
    {
        BorderRouter br;
        Config       conf = mDefaultConf;

        error = PrepareDtlsConfig(nid, conf);
        if (error != ERROR_NONE)
        {
            ErrorMsg(nid, error.GetMessage());
            error = ERROR_NONE;
            continue;
        }
        {
            auto entry = mCommissionerPool.find(nid);
            if (entry == mCommissionerPool.end())
            {
                CommissionerAppPtr commissioner;

                SuccessOrExit(error = CommissionerAppCreate(commissioner, conf));
                mCommissionerPool[nid] = commissioner;
                entry                  = mCommissionerPool.find(nid);
            }

            bool active = entry->second->IsActive();
            if (active)
            {
                if (!aGroupAlias)
                {
                    InfoMsg(nid, "already started");
                }
                continue;
            }

            SuccessOrExit(error = MakeBorderRouterChoice(nid, br));
            auto expr = aExpr;
            expr.push_back(br.mAgent.mAddr);
            expr.push_back(std::to_string(br.mAgent.mPort));
            ASSERT(expr.size() == 3); // 'start br_addr br_port'
            SuccessOrExit(error = CreateJob(entry->second, expr, nid));
        }
    }
exit:
    return error;
}